

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_search.hpp
# Opt level: O3

search_result * __thiscall
cvs_rk::local_search::run_fixed_n_all_neighbors
          (search_result *__return_storage_ptr__,local_search *this,
          vector<bool,_std::allocator<bool>_> *initial_solution)

{
  search_result *psVar1;
  pointer pvVar2;
  iterator iVar3;
  pointer pvVar4;
  ostream *poVar5;
  ulong uVar6;
  pointer pvVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  pointer pmVar14;
  double dVar15;
  set<cvs_rk::mod_int<9223372036854775783UL>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_nicolaprezza[P]cvs_rk_internal_local_search_hpp:160:15),_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  distinct_rows;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  new_vec;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  sum;
  mod_int<9223372036854775783UL> c;
  double local_268;
  double local_260;
  ulong local_250;
  double local_248;
  undefined1 local_238 [8];
  pointer pmStack_230;
  pointer local_228;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  local_210;
  search_result *local_1f8;
  double local_1f0;
  _Rb_tree<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>,std::_Identity<std::vector<bool,std::allocator<bool>>>,std::less<std::vector<bool,std::allocator<bool>>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
  *local_1e8;
  ulong local_1e0;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  local_1d8;
  _Base_ptr local_1c0;
  undefined1 local_1b8 [16];
  _Base_ptr p_Stack_1a8;
  _Base_ptr p_Stack_1a0;
  _Base_ptr p_Stack_198;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  vStack_190;
  vector<bool,_std::allocator<bool>_> local_178;
  pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
  local_150;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  local_110;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  local_f8;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  local_e0;
  vector<bool,_std::allocator<bool>_> local_c8;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  local_a0;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  local_88;
  pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
  local_70;
  
  local_1f8 = __return_storage_ptr__;
  std::vector<bool,_std::allocator<bool>_>::vector(&local_c8,initial_solution);
  if (local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  matrix<cvs_rk::rk_function<9223372036854775783UL>_>::hashed_rows(&local_1d8,&this->M);
  pvVar4 = (this->M).columns.
           super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->M).columns.
           super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar2 != pvVar4) {
    lVar8 = 0;
    uVar11 = 0;
    do {
      uVar6 = uVar11 + 0x3f;
      if (-1 < (long)uVar11) {
        uVar6 = uVar11;
      }
      if (((initial_solution->super__Bvector_base<std::allocator<bool>_>)._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
           [((long)uVar6 >> 6) +
            (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
           (uVar11 & 0x3f) & 1) == 0) {
        operator-((vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                   *)local_238,&local_1d8,
                  (vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                   *)((long)&(pvVar4->
                             super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + lVar8));
        pmVar14 = local_1d8.
                  super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_1d8.
        super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_228;
        local_228 = (pointer)0x0;
        local_1d8.
        super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_238;
        local_1d8.
        super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pmStack_230;
        local_238 = (undefined1  [8])0x0;
        pmStack_230 = (pointer)0x0;
        if ((pmVar14 != (pointer)0x0) &&
           (operator_delete(pmVar14), local_238 != (undefined1  [8])0x0)) {
          operator_delete((void *)local_238);
        }
        pvVar4 = (this->M).columns.
                 super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar2 = (this->M).columns.
                 super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar11 = uVar11 + 1;
      lVar8 = lVar8 + 0x18;
    } while (uVar11 < (ulong)(((long)pvVar2 - (long)pvVar4 >> 3) * -0x5555555555555555));
  }
  std::
  pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
  ::
  pair<std::vector<bool,_std::allocator<bool>_>_&,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_&,_true>
            ((pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
              *)local_238,initial_solution,&local_1d8);
  local_1e8 = (_Rb_tree<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>,std::_Identity<std::vector<bool,std::allocator<bool>>>,std::less<std::vector<bool,std::allocator<bool>>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
               *)&this->explored;
  std::
  _Rb_tree<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>,std::_Identity<std::vector<bool,std::allocator<bool>>>,std::less<std::vector<bool,std::allocator<bool>>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
  ::_M_insert_unique<std::vector<bool,std::allocator<bool>>const&>
            (local_1e8,(vector<bool,_std::allocator<bool>_> *)local_238);
  std::
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  ::vector(&local_e0,&local_210);
  local_260 = HK<cvs_rk::mod_int<9223372036854775783ul>>(&local_e0);
  if (local_e0.
      super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.
                    super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
  ::pair(&local_150,
         (pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
          *)local_238);
  local_1c0 = &(this->explored)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1e0 = 0x800000000000003f;
  local_248 = local_260;
  do {
    dVar15 = local_248;
    pvVar4 = (this->M).columns.
             super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (this->M).columns.
             super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pvVar2 != pvVar4) {
      local_250 = 0;
      do {
        pvVar7 = pvVar4;
        if (pvVar2 != pvVar4) {
          uVar11 = local_250 + 0x3f;
          if (-1 < (long)local_250) {
            uVar11 = local_250;
          }
          uVar6 = (ulong)((local_250 & local_1e0) < 0x8000000000000001);
          uVar10 = 1L << (local_250 & 0x3f);
          lVar8 = 0;
          uVar13 = 0;
          do {
            if ((((pointer)((long)local_238 + (((long)uVar11 >> 6) + (uVar6 - 1)) * 8))->val &
                uVar10) == 0) {
              uVar12 = uVar13 + 0x3f;
              if (-1 < (long)uVar13) {
                uVar12 = uVar13;
              }
              uVar9 = (ulong)((uVar13 & local_1e0) < 0x8000000000000001);
              if ((((pointer)((long)local_238 + (((long)uVar12 >> 6) + (uVar9 - 1)) * 8))->val >>
                   (uVar13 & 0x3f) & 1) != 0) {
                std::vector<bool,_std::allocator<bool>_>::vector
                          (&local_178,(vector<bool,_std::allocator<bool>_> *)local_238);
                local_1b8._0_8_ = (_Bit_type *)0x0;
                local_1b8._8_8_ = 0;
                p_Stack_1a8 = (_Base_ptr)0x0;
                p_Stack_1a0 = (_Base_ptr)0x0;
                p_Stack_198 = (_Base_ptr)0x0;
                vStack_190.
                super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                vStack_190.
                super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                vStack_190.
                super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_178.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                [((long)uVar11 >> 6) + (uVar6 - 1)] =
                     local_178.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     [((long)uVar11 >> 6) + (uVar6 - 1)] | uVar10;
                local_178.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                [((long)uVar12 >> 6) + (uVar9 - 1)] =
                     local_178.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     [((long)uVar12 >> 6) + (uVar9 - 1)] & ~(1L << (uVar13 & 0x3f));
                iVar3 = std::
                        _Rb_tree<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>,_std::_Identity<std::vector<bool,_std::allocator<bool>_>_>,_std::less<std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                        ::find((_Rb_tree<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>,_std::_Identity<std::vector<bool,_std::allocator<bool>_>_>,_std::less<std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                *)local_1e8,&local_178);
                if (iVar3._M_node == local_1c0) {
                  std::
                  _Rb_tree<std::vector<bool,std::allocator<bool>>,std::vector<bool,std::allocator<bool>>,std::_Identity<std::vector<bool,std::allocator<bool>>>,std::less<std::vector<bool,std::allocator<bool>>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
                  ::_M_insert_unique<std::vector<bool,std::allocator<bool>>const&>
                            (local_1e8,&local_178);
                  operator+(&local_88,&local_210,
                            (this->M).columns.
                            super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + local_250);
                  operator-(&local_a0,&local_88,
                            (vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                             *)((long)&(((this->M).columns.
                                         super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                                       )._M_impl.super__Vector_impl_data + lVar8));
                  std::
                  pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
                  ::
                  pair<std::vector<bool,_std::allocator<bool>_>_&,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_&,_true>
                            (&local_70,&local_178,&local_a0);
                  std::
                  pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
                  ::operator=((pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
                               *)local_1b8,&local_70);
                  if (local_70.second.
                      super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_70.second.
                                    super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_70.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                      (_Bit_type *)0x0) {
                    operator_delete(local_70.first.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_start.
                                    super__Bit_iterator_base._M_p);
                  }
                  std::
                  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                  ::vector(&local_f8,&vStack_190);
                  local_1f0 = HK<cvs_rk::mod_int<9223372036854775783ul>>(&local_f8);
                  if (local_f8.
                      super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_f8.
                                    super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_260 <= local_1f0) {
                    std::vector<bool,_std::allocator<bool>_>::operator=
                              (&local_150.first,(vector<bool,_std::allocator<bool>_> *)local_1b8);
                    std::
                    vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                    ::operator=(&local_150.second,&vStack_190);
                    local_260 = local_1f0;
                  }
                  if (local_a0.
                      super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_a0.
                                    super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_88.
                      super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_88.
                                    super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
                if (vStack_190.
                    super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(vStack_190.
                                  super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
                }
                if ((_Bit_type *)local_1b8._0_8_ != (_Bit_type *)0x0) {
                  operator_delete((void *)local_1b8._0_8_);
                }
                if (local_178.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                    (_Bit_type *)0x0) {
                  operator_delete(local_178.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
                  local_178.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0
                  ;
                  local_178.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
                }
                pvVar4 = (this->M).columns.
                         super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pvVar2 = (this->M).columns.
                         super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              }
            }
            uVar13 = uVar13 + 1;
            lVar8 = lVar8 + 0x18;
            pvVar7 = pvVar2;
          } while (uVar13 < (ulong)(((long)pvVar2 - (long)pvVar4 >> 3) * -0x5555555555555555));
        }
        local_250 = local_250 + 1;
        pvVar2 = pvVar7;
      } while (local_250 < (ulong)(((long)pvVar7 - (long)pvVar4 >> 3) * -0x5555555555555555));
    }
    local_268 = local_248;
    if (local_248 < local_260) {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)local_238,&local_150.first);
      std::
      vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
      ::operator=(&local_210,&local_150.second);
      local_268 = local_260;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Current best solution: H(K) = ",0x1e);
    poVar5 = std::ostream::_M_insert<double>(local_268);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    local_248 = local_268;
  } while (dVar15 < local_260);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Local maximum reached. Search terminated.",0x29);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  p_Stack_1a0 = (_Base_ptr)(local_1b8 + 8);
  local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffff00000000;
  p_Stack_1a8 = (_Base_ptr)0x0;
  vStack_190.
  super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  p_Stack_198 = p_Stack_1a0;
  if (local_210.
      super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_210.
      super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pmVar14 = local_210.
              super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_70.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)pmVar14->val;
      std::
      _Rb_tree<cvs_rk::mod_int<9223372036854775783ul>,cvs_rk::mod_int<9223372036854775783ul>,std::_Identity<cvs_rk::mod_int<9223372036854775783ul>>,cvs_rk::local_search::run_fixed_n_all_neighbors(std::vector<bool,std::allocator<bool>>)::{lambda(cvs_rk::mod_int<9223372036854775783ul>,cvs_rk::mod_int<9223372036854775783ul>)#1},std::allocator<cvs_rk::mod_int<9223372036854775783ul>>>
      ::_M_insert_unique<cvs_rk::mod_int<9223372036854775783ul>const&>
                ((_Rb_tree<cvs_rk::mod_int<9223372036854775783ul>,cvs_rk::mod_int<9223372036854775783ul>,std::_Identity<cvs_rk::mod_int<9223372036854775783ul>>,cvs_rk::local_search::run_fixed_n_all_neighbors(std::vector<bool,std::allocator<bool>>)::_lambda(cvs_rk::mod_int<9223372036854775783ul>,cvs_rk::mod_int<9223372036854775783ul>)_1_,std::allocator<cvs_rk::mod_int<9223372036854775783ul>>>
                  *)local_1b8,(mod_int<9223372036854775783UL> *)&local_70);
      pmVar14 = pmVar14 + 1;
    } while (pmVar14 !=
             local_210.
             super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  psVar1 = local_1f8;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_1f8->B,(vector<bool,_std::allocator<bool>_> *)local_238);
  psVar1->HK = local_268;
  std::
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  ::vector(&local_110,&local_210);
  dVar15 = H<cvs_rk::mod_int<9223372036854775783ul>>(&local_110);
  psVar1->H = dVar15;
  psVar1->distinct_rows =
       (int)vStack_190.
            super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_110.
      super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.
                    super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<cvs_rk::mod_int<9223372036854775783UL>,_cvs_rk::mod_int<9223372036854775783UL>,_std::_Identity<cvs_rk::mod_int<9223372036854775783UL>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/nicolaprezza[P]cvs-rk/internal/local_search.hpp:160:15),_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  ::~_Rb_tree((_Rb_tree<cvs_rk::mod_int<9223372036854775783UL>,_cvs_rk::mod_int<9223372036854775783UL>,_std::_Identity<cvs_rk::mod_int<9223372036854775783UL>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_nicolaprezza[P]cvs_rk_internal_local_search_hpp:160:15),_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
               *)local_1b8);
  if (local_150.second.
      super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.second.
                    super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_150.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_150.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_210.
      super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_210.
                    super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_238 != (undefined1  [8])0x0) {
    operator_delete((void *)local_238);
    local_238 = (undefined1  [8])0x0;
    pmStack_230 = (pointer)((ulong)pmStack_230 & 0xffffffff00000000);
  }
  if (local_1d8.
      super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.
                    super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return psVar1;
}

Assistant:

search_result run_fixed_n_all_neighbors(vector<bool> initial_solution){

		int N = weight(initial_solution);

		auto hashed_vec = M.hashed_rows();

		for(ulint i=0;i<M.n_columns();++i){

			//remove column from hashed vector
			if(not initial_solution[i]){

				hashed_vec = hashed_vec - M.column(i);

			}

		}

		candidate_t C = {

				initial_solution,
				hashed_vec

		};

		explored.insert(C.first);

		//best H(K): entropy of current solution
		double best_HK = HK<matrix_t::mod_int_t>(C.second);
		double C_HK = best_HK;

		candidate_t best_C = C;

		bool local_max = false;

		//proceed until a local maximum is reached
		while(not local_max){

			//init as true, then check all neighbors
			//if at least 1 neighbor improves the score
			//of C, then local_max = false
			local_max = true;

			//try all neighbors
			//the set of neighbors is built trying all possible O(L^2) combinations
			//of both a flip 0->1 and a flip 1->0
			for(ulint j0 = 0;j0<M.n_columns();++j0){//0->1

				for(ulint j1 = 0;j1<M.n_columns();++j1){//1->0

					if(not C.first[j0] and C.first[j1]){

						auto B = C.first;
						candidate_t new_C;		//neighbor

						B[j0] = true;
						B[j1] = false;

						assert(N==weight(B));

						if(explored.find(B) == explored.end()){

							explored.insert(B);

							auto sum = C.second + M.column(j0);	//sum j0-th column
							auto new_vec = sum-M.column(j1);	//subtract j1-th column

							//new candidate
							new_C = {
									B,
									new_vec
							};

							//compute counts entropy
							double new_HK = HK<matrix_t::mod_int_t>(new_C.second);

							//cout << new_HK << endl;

							if(new_HK>=best_HK){

								best_HK = new_HK;
								best_C = new_C;

							}

						}

					}

				}

			}//end neighbor search cycle

			//if at least 1 neighbor strictly improves
			//C's entropy, then C is not a local maximum
			local_max = best_HK <= C_HK;

			if(not local_max){
				C  = best_C;
				C_HK = best_HK;
			}

			cout << "Current best solution: H(K) = " << C_HK << endl;

			if(local_max){

				cout << "Local maximum reached. Search terminated." << endl;

			}

		}

		auto comp = [](matrix_t::mod_int_t x, matrix_t::mod_int_t y){ return x < y; };
		std::set<matrix_t::mod_int_t,decltype(comp)> distinct_rows(comp);

		for(auto c:C.second) distinct_rows.insert(c);

		return {C.first, C_HK, H<matrix_t::mod_int_t>(C.second), int(distinct_rows.size())};

	}